

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall BenevolentBotStrategy::place(BenevolentBotStrategy *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  reference ppCVar4;
  int *piVar5;
  double dVar6;
  Country *country_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2_1;
  Country *country;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  int weakest;
  int count;
  BenevolentBotStrategy *this_local;
  
  if (*(this->super_PlayerStrategy).numWeakest == -1) {
    __range2._4_4_ = 0;
    __range2._0_4_ = 0;
    pvVar3 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar3);
    country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                  *)&country);
      if (!bVar1) break;
      ppCVar4 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppCVar4;
      if ((int)__range2 == 0) {
LAB_0010d121:
        __range2._0_4_ = Map::Country::getNumberOfTroops(this_00);
      }
      else {
        iVar2 = Map::Country::getNumberOfTroops(this_00);
        if (iVar2 < (int)__range2) goto LAB_0010d121;
      }
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    pvVar3 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    __end2_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar3);
    country_1 = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar3)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                          *)&country_1);
      if (!bVar1) break;
      ppCVar4 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2_1);
      iVar2 = Map::Country::getNumberOfTroops(*ppCVar4);
      if (iVar2 == (int)__range2) {
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2_1);
    }
    piVar5 = (int *)operator_new(4);
    *piVar5 = __range2._4_4_;
    (this->super_PlayerStrategy).numWeakest = piVar5;
  }
  dVar6 = ceil((double)*(this->super_PlayerStrategy).armiesToPlace /
               (double)*(this->super_PlayerStrategy).numWeakest);
  return (int)dVar6;
}

Assistant:

int BenevolentBotStrategy::place() {
    if (*numWeakest == -1) {
        int count = 0;
        int weakest = 0;
        for (auto* country : *player->getOwnedCountries()) {
            if (weakest == 0 || country->getNumberOfTroops() < weakest) {
                weakest = country->getNumberOfTroops();
            }
        }

        // Then find out how many other countries have the same number of armies as it
        for (auto* country : *player->getOwnedCountries()) {
            if (country->getNumberOfTroops() == weakest) {
                count++;
            }
        }

        numWeakest = new int(count);
    }
    return ceil((double)*armiesToPlace / (double)*numWeakest);
}